

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLStateMachine.cpp
# Opt level: O2

string * __thiscall
SQLStateMachine::get_parse_key_abi_cxx11_
          (string *__return_storage_ptr__,SQLStateMachine *this,int state)

{
  bool bVar1;
  undefined4 in_EAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined4 uStack_18;
  int local_14;
  
  _uStack_18 = CONCAT44(state,in_EAX);
  bVar1 = Map::
          Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::contains(&this->parse_states,&local_14);
  if (bVar1) {
    pbVar2 = Map::
             Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&this->parse_states,&local_14);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",(allocator *)((long)&uStack_18 + 3));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SQLStateMachine::get_parse_key(int state) {
    if (parse_states.contains(state))
        return parse_states[state];
    else
        return "";
}